

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_region.cpp
# Opt level: O0

void __thiscall Region_Single_Test::TestBody(Region_Single_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer *this_01;
  bool bVar1;
  char *pcVar2;
  __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02
  ;
  char *in_R9;
  string local_1a8;
  AssertHelper local_188;
  Message local_180;
  bool local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_;
  Message local_158;
  uint64_t local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_3;
  Message local_130;
  uint64_t local_128;
  uint local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_2;
  Message local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_1;
  element_type *region0;
  AssertHelper local_c8;
  Message local_c0;
  size_type local_b8;
  uint local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
  result;
  undefined1 local_70 [8];
  mem_based_factory factory;
  undefined1 local_38 [8];
  shared_ptr<pstore::file::in_memory> file;
  shared_ptr<unsigned_char> sp;
  size_t size;
  Region_Single_Test *this_local;
  
  sp.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x20;
  this_00 = &file.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  anon_unknown.dwarf_1ca3d2::Region::make_array((Region *)this_00,(size_t)this);
  std::
  make_shared<pstore::file::in_memory,std::shared_ptr<unsigned_char>&,unsigned_long_const&,unsigned_long_const&>
            ((shared_ptr<unsigned_char> *)local_38,(unsigned_long *)this_00,
             (unsigned_long *)
             &sp.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  this_01 = &result.
             super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::shared_ptr<pstore::file::in_memory>::shared_ptr
            ((shared_ptr<pstore::file::in_memory> *)this_01,
             (shared_ptr<pstore::file::in_memory> *)local_38);
  pstore::region::mem_based_factory::mem_based_factory
            ((mem_based_factory *)local_70,(shared_ptr<pstore::file::in_memory> *)this_01,0x20,0x20)
  ;
  std::shared_ptr<pstore::file::in_memory>::~shared_ptr
            ((shared_ptr<pstore::file::in_memory> *)
             &result.
              super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pstore::region::mem_based_factory::init
            ((mem_based_factory *)&gtest_ar.message_,(EVP_PKEY_CTX *)local_70);
  local_ac = 1;
  local_b8 = std::
             vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
             ::size((vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                     *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_a8,"1U","result.size ()",&local_ac,&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
               ,0x30,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  if (bVar1) {
    this_02 = (__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                 ::at((vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                       *)&gtest_ar.message_,0);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )std::
           __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*(this_02);
    pstore::memory_mapper_base::data((memory_mapper_base *)local_f8);
    testing::internal::EqHelper::
    Compare<std::shared_ptr<unsigned_char>,_std::shared_ptr<const_void>,_nullptr>
              ((EqHelper *)local_e8,"sp","region0.data ()",
               (shared_ptr<unsigned_char> *)
               &file.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(shared_ptr<const_void> *)local_f8);
    std::shared_ptr<const_void>::~shared_ptr((shared_ptr<const_void> *)local_f8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
    if (!bVar1) {
      testing::Message::Message(&local_100);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0x33,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_100);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_100);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
    local_11c = 0;
    local_128 = pstore::memory_mapper_base::offset
                          ((memory_mapper_base *)
                           gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              ((EqHelper *)local_118,"0U","region0.offset ()",&local_11c,&local_128);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
    if (!bVar1) {
      testing::Message::Message(&local_130);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0x34,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_130);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_130);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
    local_150 = pstore::memory_mapper_base::size
                          ((memory_mapper_base *)
                           gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_148,"size","region0.size ()",
               (unsigned_long *)
               &sp.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_150);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
    if (!bVar1) {
      testing::Message::Message(&local_158);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0x35,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_158);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      testing::Message::~Message(&local_158);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
    local_171 = pstore::memory_mapper_base::is_writable
                          ((memory_mapper_base *)
                           gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_170,&local_171,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
    if (!bVar1) {
      testing::Message::Message(&local_180);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_1a8,(internal *)local_170,(AssertionResult *)"region0.is_writable ()",
                 "false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_188,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0x36,pcVar2);
      testing::internal::AssertHelper::operator=(&local_188,&local_180);
      testing::internal::AssertHelper::~AssertHelper(&local_188);
      std::__cxx11::string::~string((string *)&local_1a8);
      testing::Message::~Message(&local_180);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  }
  std::
  vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
  ::~vector((vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
             *)&gtest_ar.message_);
  pstore::region::mem_based_factory::~mem_based_factory((mem_based_factory *)local_70);
  std::shared_ptr<pstore::file::in_memory>::~shared_ptr
            ((shared_ptr<pstore::file::in_memory> *)local_38);
  std::shared_ptr<unsigned_char>::~shared_ptr
            ((shared_ptr<unsigned_char> *)
             &file.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST_F (Region, Single) {
    constexpr std::size_t size = 32;

    auto sp = this->make_array (size);
    auto file = std::make_shared<pstore::file::in_memory> (sp, size, size);

    pstore::region::mem_based_factory factory (file, size, size);
    std::vector<std::shared_ptr<pstore::memory_mapper_base>> result = factory.init ();

    ASSERT_EQ (1U, result.size ());

    auto const & region0 = *(result.at (0));
    EXPECT_EQ (sp, region0.data ());
    EXPECT_EQ (0U, region0.offset ());
    EXPECT_EQ (size, region0.size ());
    EXPECT_TRUE (region0.is_writable ());
}